

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetPrototypeForLazyMessage
          (ExtensionSet *this,MessageLite *extendee,int number)

{
  bool bVar1;
  bool was_packed_on_wire;
  GeneratedExtensionFinder finder;
  ExtensionInfo extension_info;
  
  was_packed_on_wire = false;
  extension_info.descriptor = (FieldDescriptor *)0x0;
  extension_info.lazy_eager_verify_func = (LazyEagerVerifyFnType)0x0;
  extension_info.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
  extension_info.field_6.enum_validity_check.arg = (void *)0x0;
  extension_info.message = (MessageLite *)0x0;
  extension_info.number = 0;
  extension_info.type = '\0';
  extension_info.is_repeated = false;
  extension_info.is_packed = false;
  extension_info.is_lazy = kUndefined;
  finder.extendee_ = extendee;
  bVar1 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                    (this,2,number,&finder,&extension_info,&was_packed_on_wire);
  if (!bVar1) {
    extension_info.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)(MessageLite *)0x0;
  }
  return (MessageLite *)extension_info.field_6.enum_validity_check.func;
}

Assistant:

const MessageLite* ExtensionSet::GetPrototypeForLazyMessage(
    const MessageLite* extendee, int number) const {
  GeneratedExtensionFinder finder(extendee);
  bool was_packed_on_wire = false;
  ExtensionInfo extension_info;
  if (!FindExtensionInfoFromFieldNumber(
          WireFormatLite::WireType::WIRETYPE_LENGTH_DELIMITED, number, &finder,
          &extension_info, &was_packed_on_wire)) {
    return nullptr;
  }
  return extension_info.message_info.prototype;
}